

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O2

void __thiscall
vkt::texture::SampleVerifier::getFilteredSample1D
          (SampleVerifier *this,IVec3 *texelBase,float weight,int layer,int level,Vec4 *resultMin,
          Vec4 *resultMax)

{
  double *pdVar1;
  int i;
  long lVar2;
  Vec4 *pVVar3;
  Interval *x;
  Vec4 *pVVar4;
  int compNdx;
  long lVar5;
  float fVar6;
  undefined1 local_160 [16];
  double dStack_150;
  Vec4 *local_148;
  Vec4 *local_140;
  Interval weightInterval;
  Interval local_120;
  Vec4 texelsMax [2];
  Vec4 texelsMin [2];
  Interval resultIntervals [4];
  Interval local_60;
  Interval local_48;
  
  lVar2 = 0;
  local_148 = resultMin;
  local_140 = resultMax;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texelsMin[0].m_data + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)texelsMax[0].m_data + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x20);
  pVVar4 = texelsMax;
  pVVar3 = texelsMin;
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    weightInterval._0_4_ = SUB84(lVar2,0);
    weightInterval._4_8_ = 0;
    tcu::operator+((tcu *)resultIntervals,texelBase,(Vector<int,_3> *)&weightInterval);
    fetchTexel(this,(IVec3 *)resultIntervals,layer,level,VK_FILTER_LINEAR,pVVar3,pVVar4);
    pVVar4 = pVVar4 + 1;
    pVVar3 = pVVar3 + 1;
  }
  lVar2 = 8;
  do {
    *(undefined1 *)((long)texelsMin[1].m_data + lVar2 + 8) = 0;
    *(undefined8 *)(&resultIntervals[0].m_hasNaN + lVar2) = 0x7ff0000000000000;
    *(undefined8 *)((long)&resultIntervals[0].m_lo + lVar2) = 0xfff0000000000000;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x68);
  for (lVar2 = 8; lVar2 != 0x68; lVar2 = lVar2 + 0x18) {
    *(undefined1 *)((long)texelsMin[1].m_data + lVar2 + 8) = 0;
    *(undefined8 *)(&resultIntervals[0].m_hasNaN + lVar2) = 0;
    *(undefined8 *)((long)&resultIntervals[0].m_lo + lVar2) = 0;
  }
  pVVar4 = texelsMax;
  pVVar3 = texelsMin;
  for (lVar2 = 0; x = resultIntervals, lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar6 = 1.0 - weight;
    if (lVar2 != 0) {
      fVar6 = weight;
    }
    local_160[0] = NAN(fVar6);
    local_160._8_8_ = INFINITY;
    if (!local_160[0]) {
      local_160._8_8_ = (double)fVar6;
    }
    dStack_150 = -INFINITY;
    if (!local_160[0]) {
      dStack_150 = (double)fVar6;
    }
    tcu::FloatFormat::roundOut
              (&weightInterval,&this->m_filteringPrecision,(Interval *)local_160,false);
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      local_160[0] = false;
      unique0x1000009f = SUB84((double)pVVar4->m_data[lVar5],0);
      local_160._8_8_ = (double)pVVar3->m_data[lVar5];
      unique0x100000a3 = (int)((ulong)(double)pVVar4->m_data[lVar5] >> 0x20);
      tcu::operator*(&local_60,&weightInterval,(Interval *)local_160);
      tcu::operator+(&local_48,x,&local_60);
      tcu::FloatFormat::roundOut(&local_120,&this->m_filteringPrecision,&local_48,false);
      x->m_hi = local_120.m_hi;
      x->m_hasNaN = local_120.m_hasNaN;
      *(undefined7 *)&x->field_0x1 = local_120._1_7_;
      x->m_lo = local_120.m_lo;
      x = x + 1;
    }
    pVVar4 = pVVar4 + 1;
    pVVar3 = pVVar3 + 1;
  }
  pdVar1 = &resultIntervals[0].m_hi;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    local_148->m_data[lVar2] = (float)pdVar1[-1];
    local_140->m_data[lVar2] = (float)*pdVar1;
    pdVar1 = pdVar1 + 3;
  }
  return;
}

Assistant:

void SampleVerifier::getFilteredSample1D (const IVec3&	texelBase,
										  float			weight,
										  int			layer,
										  int			level,
										  Vec4&			resultMin,
										  Vec4&			resultMax) const
{
	Vec4 texelsMin[2];
	Vec4 texelsMax[2];

	for (int i = 0; i < 2; ++i)
	{
	    fetchTexel(texelBase + IVec3(i, 0, 0), layer, level, VK_FILTER_LINEAR, texelsMin[i], texelsMax[i]);
	}

	Interval resultIntervals[4];

	for (int ndx = 0; ndx < 4; ++ndx)
	{
		resultIntervals[ndx] = Interval(0.0);
	}

    for (int i = 0; i < 2; ++i)
	{
		const Interval weightInterval = m_filteringPrecision.roundOut(Interval(i == 0 ? 1.0f - weight : weight), false);

		for (int compNdx = 0; compNdx < 4; ++compNdx)
		{
			const Interval texelInterval(false, texelsMin[i][compNdx], texelsMax[i][compNdx]);

			resultIntervals[compNdx] = m_filteringPrecision.roundOut(resultIntervals[compNdx] + weightInterval * texelInterval, false);
		}
	}

	for (int compNdx = 0; compNdx < 4; ++compNdx)
	{
		resultMin[compNdx] = (float)resultIntervals[compNdx].lo();
		resultMax[compNdx] = (float)resultIntervals[compNdx].hi();
	}
}